

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::ConvertToRgb(uint8_t *outY,uint8_t *outYEnd,uint8_t *inY,uint32_t rowSizeOut,
                      uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,
                      uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte *pbVar7;
  uint in_ECX;
  undefined1 (*in_RDX) [16];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  byte in_R9B;
  uint8_t *inXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd src1;
  simd *srcEnd;
  simd *dst;
  simd *src;
  simd ctrl3;
  simd ctrl2;
  simd ctrl1;
  void *local_228;
  byte *local_220;
  undefined8 *local_1f8;
  undefined1 (*local_1f0) [16];
  undefined1 (*local_1a8) [16];
  undefined8 *local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_148;
  undefined8 uStack_140;
  
  auVar1 = vpinsrb_avx(ZEXT116(0),0,1);
  auVar1 = vpinsrb_avx(auVar1,0,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,2,6);
  auVar1 = vpinsrb_avx(auVar1,2,7);
  auVar1 = vpinsrb_avx(auVar1,2,8);
  auVar1 = vpinsrb_avx(auVar1,3,9);
  auVar1 = vpinsrb_avx(auVar1,3,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,4,0xc);
  auVar1 = vpinsrb_avx(auVar1,4,0xd);
  auVar1 = vpinsrb_avx(auVar1,4,0xe);
  auVar1 = vpinsrb_avx(auVar1,5,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(5),5,1);
  auVar2 = vpinsrb_avx(auVar2,6,2);
  auVar2 = vpinsrb_avx(auVar2,6,3);
  auVar2 = vpinsrb_avx(auVar2,6,4);
  auVar2 = vpinsrb_avx(auVar2,7,5);
  auVar2 = vpinsrb_avx(auVar2,7,6);
  auVar2 = vpinsrb_avx(auVar2,7,7);
  auVar2 = vpinsrb_avx(auVar2,8,8);
  auVar2 = vpinsrb_avx(auVar2,8,9);
  auVar2 = vpinsrb_avx(auVar2,8,10);
  auVar2 = vpinsrb_avx(auVar2,9,0xb);
  auVar2 = vpinsrb_avx(auVar2,9,0xc);
  auVar2 = vpinsrb_avx(auVar2,9,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  auVar2 = vpinsrb_avx(auVar2,10,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(10),0xb,1);
  auVar3 = vpinsrb_avx(auVar3,0xb,2);
  auVar3 = vpinsrb_avx(auVar3,0xb,3);
  auVar3 = vpinsrb_avx(auVar3,0xc,4);
  auVar3 = vpinsrb_avx(auVar3,0xc,5);
  auVar3 = vpinsrb_avx(auVar3,0xc,6);
  auVar3 = vpinsrb_avx(auVar3,0xd,7);
  auVar3 = vpinsrb_avx(auVar3,0xd,8);
  auVar3 = vpinsrb_avx(auVar3,0xd,9);
  auVar3 = vpinsrb_avx(auVar3,0xe,10);
  auVar3 = vpinsrb_avx(auVar3,0xe,0xb);
  auVar3 = vpinsrb_avx(auVar3,0xe,0xc);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xd);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xe);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xf);
  local_1a8 = in_RDX;
  for (local_198 = in_RDI; local_198 != in_RSI;
      local_198 = (undefined8 *)((long)local_198 + (ulong)in_ECX)) {
    local_1f8 = local_198;
    for (local_1f0 = local_1a8; local_1f0 != local_1a8 + (uint)inXEnd; local_1f0 = local_1f0 + 1) {
      auVar6 = *local_1f0;
      auVar5 = *local_1f0;
      auVar4 = vpshufb_avx(*local_1f0,auVar1);
      local_148 = auVar4._0_8_;
      uStack_140 = auVar4._8_8_;
      *local_1f8 = local_148;
      local_1f8[1] = uStack_140;
      auVar4 = vpshufb_avx(auVar5,auVar2);
      local_168 = auVar4._0_8_;
      uStack_160 = auVar4._8_8_;
      local_1f8[2] = local_168;
      local_1f8[3] = uStack_160;
      auVar4 = vpshufb_avx(auVar6,auVar3);
      local_188 = auVar4._0_8_;
      uStack_180 = auVar4._8_8_;
      local_1f8[4] = local_188;
      local_1f8[5] = uStack_180;
      local_1f8 = local_1f8 + 6;
    }
    if ((uint)inX != 0) {
      local_220 = *local_1a8 + (uint)outX;
      local_228 = (void *)((long)local_198 + (ulong)((uint)outX * in_R9B));
      pbVar7 = local_220 + (uint)inX;
      for (; local_220 != pbVar7; local_220 = local_220 + 1) {
        memset(local_228,(uint)*local_220,(ulong)in_R9B);
        local_228 = (void *)((long)local_228 + (long)(int)(uint)in_R9B);
      }
    }
    local_1a8 = (undefined1 (*) [16])(*local_1a8 + in_R8D);
  }
  return;
}

Assistant:

void ConvertToRgb( uint8_t * outY, const uint8_t * outYEnd, const uint8_t * inY, uint32_t rowSizeOut, uint32_t rowSizeIn,
                       uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl1 = _mm_setr_epi8( 0, 0, 0, 1, 1, 1, 2, 2, 2, 3, 3, 3, 4, 4, 4, 5 );
        const simd ctrl2 = _mm_setr_epi8( 5, 5, 6, 6, 6, 7, 7, 7, 8, 8, 8, 9, 9, 9, 10, 10 );
        const simd ctrl3 = _mm_setr_epi8( 10, 11, 11, 11, 12, 12, 12, 13, 13, 13, 14, 14, 14, 15, 15, 15 );
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src = reinterpret_cast<const simd*>(inY);
            simd       * dst = reinterpret_cast<simd*>(outY);

            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                const simd src1 = _mm_loadu_si128( src );

                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl1 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl2 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl3 ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth*colorCount;

                const uint8_t * inXEnd = inX + nonSimdWidth;

                for( ; inX != inXEnd; outX += colorCount, ++inX )
                    memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
            }
        }
    }